

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# real-offline-flexibility-estimator.cpp
# Opt level: O1

int testDerivator(void)

{
  double dVar1;
  double ***pppdVar2;
  long lVar3;
  double ***pppdVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  ostream *poVar10;
  long *plVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  *pdVar16;
  ulong uVar17;
  Matrix<double,__1,__1,_0,__1,__1> *pMVar18;
  non_const_type *ppMVar19;
  double **ppdVar20;
  int iVar21;
  int iVar22;
  byte bVar23;
  Vector uk;
  IndexedMatrixArray state;
  GaussianWhiteNoise processNoise;
  GaussianWhiteNoise MeasurementNoise;
  Vector x0;
  Matrix r;
  Matrix q;
  Matrix r1;
  Matrix q1;
  IndexedMatrixArray dta;
  ofstream f;
  IndexedMatrixArray u;
  non_const_type local_598;
  long lStack_590;
  uint local_580 [2];
  non_const_type local_578 [2];
  double ***local_568;
  long lStack_560;
  long local_558;
  double ***pppdStack_550;
  long local_548;
  long lStack_540;
  undefined8 local_538;
  long lStack_530;
  double local_528;
  undefined1 local_520 [8];
  RhsNested local_518;
  undefined8 uStack_510;
  double ***local_508;
  long lStack_500;
  long local_4f8;
  double ***pppdStack_4f0;
  long local_4e8;
  long lStack_4e0;
  undefined8 local_4d8;
  long lStack_4d0;
  double **local_4c8;
  double ***local_4c0;
  void *local_4b8;
  void *local_4a0;
  code *local_490;
  long local_488;
  void *local_480;
  void *local_468;
  double local_458;
  double local_450;
  void *local_448 [2];
  Matrix<double,__1,__1,_0,__1,__1> local_438;
  Matrix<double,__1,__1,_0,__1,__1> local_418;
  Matrix<double,__1,__1,_0,__1,__1> local_400;
  Matrix<double,__1,__1,_0,__1,__1> local_3e8;
  undefined1 local_3d0 [8];
  Index local_3c8;
  Index local_3c0;
  undefined8 local_3b0;
  undefined8 local_3a8;
  undefined8 local_3a0;
  code *local_2e0;
  undefined8 local_2d8;
  undefined8 local_2d0;
  Matrix<double,_1,1,0,_1,1> *local_2c8;
  undefined8 local_2c0;
  long local_2b0;
  ios_base local_1e8 [264];
  IndexedMatrixArray local_e0 [8];
  deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_d8 [80];
  undefined4 local_88 [2];
  non_const_type local_80 [2];
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  bVar23 = 0;
  stateObservation::IndexedMatrixArray::IndexedMatrixArray((IndexedMatrixArray *)local_580);
  stateObservation::IndexedMatrixArray::IndexedMatrixArray((IndexedMatrixArray *)local_88);
  stateObservation::IndexedMatrixArray::IndexedMatrixArray(local_e0);
  local_418.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  local_418.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  local_418.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  local_438.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  local_438.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  local_438.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  stateObservation::IMUDynamicalSystem::IMUDynamicalSystem((IMUDynamicalSystem *)&local_2e0);
  local_3c8 = 0x12;
  local_3c0 = 0x12;
  local_3b0 = 0x12;
  local_3a8 = 0x12;
  local_3a0 = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_3e8,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
              *)local_3d0);
  uVar8 = stateObservation::IMUDynamicalSystem::getStateSize();
  stateObservation::GaussianWhiteNoise::GaussianWhiteNoise((GaussianWhiteNoise *)&local_4c8,uVar8);
  stateObservation::GaussianWhiteNoise::setStandardDeviation((Matrix *)&local_4c8);
  stateObservation::IMUDynamicalSystem::setProcessNoise((NoiseBase *)&local_2e0);
  local_520 = (undefined1  [8])&local_3e8;
  local_518.m_matrix = &local_3e8;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_3d0,
             (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
              *)local_520);
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::assign_op<double,double>>
            (&local_418,(Matrix<double,__1,__1,_0,__1,__1> *)local_3d0,
             (assign_op<double,_double> *)&local_490);
  free((void *)local_3d0);
  local_3c8 = 6;
  local_3c0 = 6;
  local_3b0 = 6;
  local_3a8 = 6;
  local_3a0 = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_400,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
              *)local_3d0);
  uVar8 = stateObservation::IMUDynamicalSystem::getMeasurementSize();
  stateObservation::GaussianWhiteNoise::GaussianWhiteNoise((GaussianWhiteNoise *)&local_490,uVar8);
  stateObservation::GaussianWhiteNoise::setStandardDeviation((Matrix *)&local_490);
  stateObservation::IMUDynamicalSystem::setMeasurementNoise((NoiseBase *)&local_2e0);
  local_520 = (undefined1  [8])&local_400;
  local_518.m_matrix = &local_400;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_3d0,
             (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
              *)local_520);
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::assign_op<double,double>>
            (&local_438,(Matrix<double,__1,__1,_0,__1,__1> *)local_3d0,
             (assign_op<double,_double> *)&local_598);
  free((void *)local_3d0);
  stateObservation::DynamicalSystemSimulator::DynamicalSystemSimulator
            ((DynamicalSystemSimulator *)local_3d0);
  stateObservation::DynamicalSystemSimulator::setDynamicsFunctor
            ((DynamicalSystemFunctorBase *)local_3d0);
  local_520 = (undefined1  [8])0x12;
  uStack_510 = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_448,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)local_520);
  iVar21 = 0;
  stateObservation::DynamicalSystemSimulator::setState((Matrix *)local_3d0,(uint)local_448);
  iVar15 = 0;
  do {
    uVar8 = stateObservation::IMUDynamicalSystem::getInputSize();
    local_520 = (undefined1  [8])(ulong)uVar8;
    uStack_510 = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_598,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)local_520);
    local_528 = (double)iVar15;
    dVar1 = sin(local_528 * 0.3141592653589793);
    if (lStack_590 < 1) {
LAB_00108f20:
      __assert_fail("index >= 0 && index < size()",
                    "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x19a,
                    "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                   );
    }
    (local_598->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data =
         (double *)(dVar1 * 0.4);
    local_450 = local_528 * 0.2617993877991494;
    dVar1 = sin(local_450);
    if (lStack_590 < 2) goto LAB_00108f20;
    (local_598->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows =
         (Index)(dVar1 * 0.6);
    local_458 = local_528 * 0.6283185307179586;
    dVar1 = sin(local_458);
    if (lStack_590 < 3) goto LAB_00108f20;
    (local_598->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols =
         (Index)(dVar1 * 0.2);
    dVar1 = sin(local_450);
    if (lStack_590 < 4) goto LAB_00108f20;
    local_598[1].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         (double *)(dVar1 * 10.0);
    dVar1 = sin(local_528 * 0.20943951023931953);
    if (lStack_590 < 5) goto LAB_00108f20;
    local_598[1].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
         (Index)(dVar1 * 0.07);
    dVar1 = sin(local_458);
    if (lStack_590 < 6) goto LAB_00108f20;
    local_598[1].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
         (Index)(dVar1 * 0.05);
    iVar22 = 0;
    do {
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_520,
                 (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_598);
      stateObservation::IndexedMatrixArray::setValue(local_e0,(Matrix *)local_520,iVar21 + iVar22);
      free((void *)local_520);
      iVar22 = iVar22 + 1;
    } while (iVar22 != 10);
    stateObservation::DynamicalSystemSimulator::setInput((Matrix *)local_3d0,(uint)&local_598);
    free(local_598);
    iVar15 = iVar15 + 1;
    iVar21 = iVar21 + 10;
  } while (iVar15 != 300);
  stateObservation::IMUDynamicalSystem::setSamplingPeriod(0.001);
  stateObservation::DynamicalSystemSimulator::simulateDynamicsTo((uint)local_3d0);
  stateObservation::DynamicalSystemSimulator::getMeasurementArray((uint)local_520,(uint)local_3d0);
  local_88[0] = local_520._0_4_;
  local_598 = local_80[0];
  lStack_590 = (long)local_80[1];
  pdVar16 = (deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
             *)&local_518;
  ppMVar19 = local_80;
  for (lVar12 = 10; lVar12 != 0; lVar12 = lVar12 + -1) {
    *ppMVar19 = *(non_const_type *)pdVar16;
    pdVar16 = pdVar16 + (ulong)bVar23 * -0x10 + 8;
    ppMVar19 = ppMVar19 + (ulong)bVar23 * -2 + 1;
  }
  local_518.m_matrix = local_80[0];
  uStack_510 = local_80[1];
  local_508 = (double ***)local_70;
  lStack_500 = uStack_68;
  local_4f8 = local_60;
  pppdStack_4f0 = (double ***)uStack_58;
  local_4e8 = local_50;
  lStack_4e0 = uStack_48;
  local_4d8 = local_40;
  lStack_4d0 = uStack_38;
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::clear((deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
           *)&local_518);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque((deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
            *)&local_518);
  stateObservation::DynamicalSystemSimulator::getStateArray((uint)local_520,(uint)local_3d0);
  lVar7 = lStack_530;
  lVar6 = lStack_540;
  lVar5 = local_548;
  pppdVar4 = pppdStack_550;
  lVar3 = local_558;
  lVar12 = lStack_560;
  pppdVar2 = local_568;
  local_580[0] = local_520._0_4_;
  local_598 = local_578[0];
  lStack_590 = (long)local_578[1];
  pdVar16 = (deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
             *)&local_518;
  ppMVar19 = local_578;
  for (lVar13 = 10; lVar13 != 0; lVar13 = lVar13 + -1) {
    *ppMVar19 = *(non_const_type *)pdVar16;
    pdVar16 = pdVar16 + (ulong)bVar23 * -0x10 + 8;
    ppMVar19 = ppMVar19 + (ulong)bVar23 * -2 + 1;
  }
  local_518.m_matrix = local_578[0];
  uStack_510 = local_578[1];
  local_508 = pppdVar2;
  lStack_500 = lVar12;
  local_4f8 = lVar3;
  pppdStack_4f0 = pppdVar4;
  local_4e8 = lVar5;
  lStack_4e0 = lVar6;
  local_4d8 = local_538;
  lStack_4d0 = lVar7;
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::clear((deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
           *)&local_518);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque((deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
            *)&local_518);
  free(local_448[0]);
  stateObservation::DynamicalSystemSimulator::~DynamicalSystemSimulator
            ((DynamicalSystemSimulator *)local_3d0);
  local_490 = stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::
              setProcessNoiseCovariance;
  free(local_468);
  free(local_480);
  free(local_400.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  local_4c8 = (double **)
              stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::
              setProcessNoiseCovariance;
  free(local_4a0);
  free(local_4b8);
  free(local_3e8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  stateObservation::IMUDynamicalSystem::~IMUDynamicalSystem((IMUDynamicalSystem *)&local_2e0);
  stateObservation::IndexedMatrixArray::IndexedMatrixArray((IndexedMatrixArray *)local_3d0);
  uVar8 = 0;
  if ((local_548 - lStack_540 >> 3) * -0x5555555555555555 +
      ((lStack_530 - (long)pppdStack_550 >> 3) + -1 + (ulong)(lStack_530 == 0)) * 0x15 !=
      (local_558 - (long)local_568 >> 3) * 0x5555555555555555) {
    uVar8 = local_580[0];
  }
  while( true ) {
    lVar12 = (local_558 - (long)local_568 >> 3) * -0x5555555555555555 +
             (local_548 - lStack_540 >> 3) * -0x5555555555555555 +
             ((lStack_530 - (long)pppdStack_550 >> 3) + -1 + (ulong)(lStack_530 == 0)) * 0x15;
    uVar9 = (local_580[0] - 1) + (int)lVar12;
    if (lVar12 == 0) {
      uVar9 = 0;
    }
    if (uVar9 < uVar8) {
      stateObservation::kine::reconstructStateTrajectory
                ((kine *)local_520,(IndexedMatrixArray *)local_3d0,0.001);
      std::ofstream::ofstream(&local_2e0);
      std::ofstream::open((char *)&local_2e0,0x114310);
      uVar8 = 0;
      if ((local_548 - lStack_540 >> 3) * -0x5555555555555555 +
          ((lStack_530 - (long)pppdStack_550 >> 3) + -1 + (ulong)(lStack_530 == 0)) * 0x15 !=
          (local_558 - (long)local_568 >> 3) * 0x5555555555555555) {
        uVar8 = local_580[0];
      }
      goto LAB_00108ba8;
    }
    local_2e0 = (code *)0x6;
    local_2d0 = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_4c8,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&local_2e0);
    lVar12 = (local_558 - (long)local_568 >> 3) * -0x5555555555555555 +
             (local_548 - lStack_540 >> 3) * -0x5555555555555555 +
             ((lStack_530 - (long)pppdStack_550 >> 3) + -1 + (ulong)(lStack_530 == 0)) * 0x15;
    if (lVar12 == 0) goto LAB_00108f01;
    if ((uVar8 < local_580[0]) || (lVar12 + (ulong)local_580[0] <= (ulong)uVar8)) goto LAB_00108f01;
    uVar14 = ((long)local_568 - lStack_560 >> 3) * -0x5555555555555555 +
             (ulong)(uVar8 - local_580[0]);
    if (uVar14 < 0x15) {
      pMVar18 = (Matrix<double,__1,__1,_0,__1,__1> *)(local_568 + (ulong)(uVar8 - local_580[0]) * 3)
      ;
    }
    else {
      if ((long)uVar14 < 1) {
        uVar17 = ~(~uVar14 / 0x15);
      }
      else {
        uVar17 = uVar14 / 0x15;
      }
      pMVar18 = (Matrix<double,__1,__1,_0,__1,__1> *)
                (pppdStack_550[uVar17] + (uVar17 * -0x15 + uVar14) * 3);
    }
    Eigen::Matrix<double,-1,1,0,-1,1>::Matrix<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((Matrix<double,_1,1,0,_1,1> *)&local_490,pMVar18);
    local_2e0 = local_490;
    local_2d8 = 3;
    local_2c0 = 0;
    local_2b0 = local_488;
    if (local_488 < 3) break;
    local_520 = (undefined1  [8])local_4c8;
    local_518.m_matrix = (non_const_type)0x3;
    local_508 = &local_4c8;
    lStack_500 = 0;
    pppdStack_4f0 = local_4c0;
    if ((long)local_4c0 < 3) break;
    local_2c8 = (Matrix<double,_1,1,0,_1,1> *)&local_490;
    Eigen::MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_1>::operator=
              ((MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1> *)
               local_520,
               (MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1> *)
               &local_2e0);
    free(local_490);
    lVar12 = (local_558 - (long)local_568 >> 3) * -0x5555555555555555 +
             (local_548 - lStack_540 >> 3) * -0x5555555555555555 +
             ((lStack_530 - (long)pppdStack_550 >> 3) + -1 + (ulong)(lStack_530 == 0)) * 0x15;
    if (lVar12 == 0) goto LAB_00108f01;
    if ((uVar8 < local_580[0]) || (lVar12 + (ulong)local_580[0] <= (ulong)uVar8)) goto LAB_00108f01;
    uVar14 = ((long)local_568 - lStack_560 >> 3) * -0x5555555555555555 +
             (ulong)(uVar8 - local_580[0]);
    if (uVar14 < 0x15) {
      pMVar18 = (Matrix<double,__1,__1,_0,__1,__1> *)(local_568 + (ulong)(uVar8 - local_580[0]) * 3)
      ;
    }
    else {
      if ((long)uVar14 < 1) {
        uVar17 = ~(~uVar14 / 0x15);
      }
      else {
        uVar17 = uVar14 / 0x15;
      }
      pMVar18 = (Matrix<double,__1,__1,_0,__1,__1> *)
                (pppdStack_550[uVar17] + (uVar17 * -0x15 + uVar14) * 3);
    }
    Eigen::Matrix<double,-1,1,0,-1,1>::Matrix<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((Matrix<double,_1,1,0,_1,1> *)&local_490,pMVar18);
    local_2e0 = local_490 + 0x18;
    local_2d8 = 3;
    local_2c0 = 3;
    local_2b0 = local_488;
    if (local_488 < 6) break;
    lStack_500 = (long)local_4c0 + -3;
    local_520 = (undefined1  [8])
                (&(((LhsNested)(local_4c8 + -3))->
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data
                + (long)local_4c0);
    local_518.m_matrix = (non_const_type)0x3;
    local_508 = &local_4c8;
    pppdStack_4f0 = local_4c0;
    if ((long)local_4c0 < 3) break;
    local_2c8 = (Matrix<double,_1,1,0,_1,1> *)&local_490;
    Eigen::MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_1>::operator=
              ((MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1> *)
               local_520,
               (MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1> *)
               &local_2e0);
    free(local_490);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_2e0,
               (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_4c8);
    stateObservation::IndexedMatrixArray::setValue
              ((IndexedMatrixArray *)local_3d0,(Matrix *)&local_2e0,uVar8);
    free(local_2e0);
    free(local_4c8);
    uVar8 = uVar8 + 1;
  }
  local_2c8 = (Matrix<double,_1,1,0,_1,1> *)&local_490;
  local_2d8 = 3;
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
LAB_00108ba8:
  lVar12 = (local_558 - (long)local_568 >> 3) * -0x5555555555555555 +
           (local_548 - lStack_540 >> 3) * -0x5555555555555555 +
           ((lStack_530 - (long)pppdStack_550 >> 3) + -1 + (ulong)(lStack_530 == 0)) * 0x15;
  uVar9 = (local_580[0] - 1) + (int)lVar12;
  if (lVar12 == 0) {
    uVar9 = 0;
  }
  if (uVar9 < uVar8) {
    local_2e0 = _VTT;
    *(undefined8 *)((long)&local_2e0 + *(long *)(_VTT + -0x18)) = _memcpy;
    std::filebuf::~filebuf((filebuf *)&local_2d8);
    std::ios_base::~ios_base(local_1e8);
    std::
    deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::~deque((deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_518);
    std::
    deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::~deque((deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_3c8);
    free(local_438.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
        );
    free(local_418.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
        );
    std::
    deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::~deque(local_d8);
    std::
    deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::~deque((deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)local_80);
    std::
    deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::~deque((deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)local_578);
    return 0;
  }
  if (((lVar12 == 0) || (uVar8 < local_580[0])) || (lVar12 + (ulong)local_580[0] <= (ulong)uVar8)) {
LAB_00108f01:
    __assert_fail("checkIndex(time) && \"Error: Time out of range\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/tools/definitions.hxx"
                  ,0x9b,"void stateObservation::IndexedMatrixArray::check_(unsigned int) const");
  }
  uVar14 = ((long)local_568 - lStack_560 >> 3) * -0x5555555555555555 + (ulong)(uVar8 - local_580[0])
  ;
  if (uVar14 < 0x15) {
    ppdVar20 = (double **)(local_568 + (ulong)(uVar8 - local_580[0]) * 3);
  }
  else {
    if ((long)uVar14 < 1) {
      uVar17 = ~(~uVar14 / 0x15);
    }
    else {
      uVar17 = uVar14 / 0x15;
    }
    ppdVar20 = pppdStack_550[uVar17] + (uVar17 * -0x15 + uVar14) * 3;
  }
  lVar12 = (local_4f8 - (long)local_508 >> 3) * -0x5555555555555555 +
           (local_4e8 - lStack_4e0 >> 3) * -0x5555555555555555 +
           ((lStack_4d0 - (long)pppdStack_4f0 >> 3) + -1 + (ulong)(lStack_4d0 == 0)) * 0x15;
  if (lVar12 == 0) goto LAB_00108f01;
  if ((uVar8 < (uint)local_520._0_4_) || (lVar12 + ((ulong)local_520 & 0xffffffff) <= (ulong)uVar8))
  goto LAB_00108f01;
  uVar14 = ((long)local_508 - lStack_500 >> 3) * -0x5555555555555555 +
           (ulong)(uVar8 - local_520._0_4_);
  if (uVar14 < 0x15) {
    local_4c0 = local_508 + (ulong)(uVar8 - local_520._0_4_) * 3;
  }
  else {
    if ((long)uVar14 < 1) {
      uVar17 = ~(~uVar14 / 0x15);
    }
    else {
      uVar17 = uVar14 / 0x15;
    }
    local_4c0 = (double ***)(pppdStack_4f0[uVar17] + (uVar17 * -0x15 + uVar14) * 3);
  }
  local_4c8 = ppdVar20;
  if (((double **)ppdVar20[1] != local_4c0[1]) || ((double **)ppdVar20[2] != local_4c0[2])) {
    __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                  "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, -1>, const Eigen::Matrix<double, -1, -1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, -1>, Rhs = const Eigen::Matrix<double, -1, -1>]"
                 );
  }
  poVar10 = Eigen::operator<<((ostream *)&local_2e0,
                              (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                               *)&local_4c8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  plVar11 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar11 + -0x18) + (char)plVar11);
  std::ostream::put((char)plVar11);
  std::ostream::flush();
  uVar8 = uVar8 + 1;
  goto LAB_00108ba8;
}

Assistant:

int testDerivator()
{
    /// The number of samples
    const unsigned kmax=3000;

    ///sampling period
    const double dt=1e-3;

    ///Sizes of the states for the state, the measurement, and the input vector
    const unsigned stateSize=18;
    const unsigned measurementSize=6;
    //const unsigned inputSize=6;

    ///The array containing all the states, the measurements and the inputs
    IndexedMatrixArray x;
    IndexedMatrixArray y;
    IndexedMatrixArray u;

    ///The covariance matrix of the process noise and the measurement noise
    Matrix q;
    Matrix r;

    {
        ///simulation of the signal
        /// the IMU dynamical system functor
        IMUDynamicalSystem imu;

        ///The process noise initialization
        Matrix q1=Matrix::Identity(stateSize,stateSize)*0.00;
        GaussianWhiteNoise processNoise(imu.getStateSize());
        processNoise.setStandardDeviation(q1);
        imu.setProcessNoise( & processNoise );
        q=q1*q1.transpose();

        ///The measurement noise initialization
        Matrix r1=Matrix::Identity(measurementSize,measurementSize)*0.0;
        GaussianWhiteNoise MeasurementNoise(imu.getMeasurementSize());
        MeasurementNoise.setStandardDeviation(r1);
        imu.setMeasurementNoise( & MeasurementNoise );
        r=r1*r1.transpose();

        ///the simulator initalization
        DynamicalSystemSimulator sim;
        sim.setDynamicsFunctor(&imu);

        ///initialization of the state vector
        Vector x0=Vector::Zero(stateSize,1);
        sim.setState(x0,0);

        ///construction of the input
        /// the input is constant over 10 time samples
        for (unsigned i=0;i<kmax/10;++i)
        {
            Vector uk=Vector::Zero(imu.getInputSize(),1);

            uk[0]=0.4 * sin(M_PI/10*i);
            uk[1]=0.6 * sin(M_PI/12*i);
            uk[2]=0.2 * sin(M_PI/5*i);

            uk[3]=10  * sin(M_PI/12*i);
            uk[4]=0.07  * sin(M_PI/15*i);
            uk[5]=0.05 * sin(M_PI/5*i);

            ///filling the 10 time samples of the constant input
            for (int j=0;j<10;++j)
            {
                u.setValue(uk,i*10+j);
            }

            ///give the input to the simulator
            ///we only need to give one value and the
            ///simulator takes automatically the appropriate value
            sim.setInput(uk,10*i);

        }

        ///set the sampling perdiod to the functor
        imu.setSamplingPeriod(dt);

        ///launched the simulation to the time kmax+1
        sim.simulateDynamicsTo(kmax+1);

        ///extract the array of measurements and states
        y = sim.getMeasurementArray(1,kmax);
        x = sim.getStateArray(1,kmax);
    }

    IndexedMatrixArray dta;

    for (unsigned i=x.getFirstIndex() ; i<=x.getLastIndex() ; ++i)
    {
        Vector xi = Vector::Zero(6,1);

        xi.head(3) = Vector(x[i]).segment(kine::pos,3);
        xi.tail(3) = Vector(x[i]).segment(kine::ori,3);

        dta.setValue(xi,i);
    }

    IndexedMatrixArray state = kine::reconstructStateTrajectory(dta,dt);

    ///file of output
    std::ofstream f;
    f.open("trajectory.dat");

    for (unsigned i=x.getFirstIndex() ; i<=x.getLastIndex() ; ++i)
    {
        //f<<dta[i].transpose()<<"\t#####\t\t"<<Vector(Vector(x[i]).segment(9,3)).transpose()<<"\t#####\t\t"<<(x[i]-state[i]).transpose()<<std::endl;
        f<<(x[i]-state[i])<<std::endl<<std::endl;
    }

    return 0;


}